

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

int uv_thread_setpriority(uv_thread_t tid,int priority)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  pthread_t __thread2;
  sched_param local_38;
  int local_34;
  sched_param param;
  int policy;
  int prio;
  int range;
  int max;
  int min;
  int r;
  int priority_local;
  uv_thread_t tid_local;
  
  if ((priority < -2) || (2 < priority)) {
    tid_local._4_4_ = -0x16;
  }
  else {
    iVar1 = pthread_getschedparam(tid,&local_34,&local_38);
    if (iVar1 == 0) {
      if (local_34 == 0) {
        __thread2 = pthread_self();
        iVar1 = pthread_equal(tid,__thread2);
        if (iVar1 != 0) {
          iVar1 = set_nice_for_calling_thread(priority);
          return iVar1;
        }
      }
      iVar1 = sched_get_priority_min(local_34);
      param.sched_priority = sched_get_priority_max(local_34);
      if ((iVar1 == -1) || (param.sched_priority == -1)) {
        piVar3 = __errno_location();
        tid_local._4_4_ = -*piVar3;
      }
      else {
        iVar2 = param.sched_priority - iVar1;
        switch(priority) {
        case 0:
          param.sched_priority = iVar1 + iVar2 / 2;
          break;
        case 1:
          param.sched_priority = iVar1 + (iVar2 * 3) / 4;
          break;
        case 2:
          break;
        case -2:
          param.sched_priority = iVar1;
          break;
        case -1:
          param.sched_priority = iVar1 + iVar2 / 4;
          break;
        default:
          return 0;
        }
        if (local_38.__sched_priority != param.sched_priority) {
          local_38.__sched_priority = param.sched_priority;
          iVar1 = pthread_setschedparam(tid,local_34,&local_38);
          if (iVar1 != 0) {
            piVar3 = __errno_location();
            return -*piVar3;
          }
        }
        tid_local._4_4_ = 0;
      }
    }
    else {
      piVar3 = __errno_location();
      tid_local._4_4_ = -*piVar3;
    }
  }
  return tid_local._4_4_;
}

Assistant:

int uv_thread_setpriority(uv_thread_t tid, int priority) {
  int r;
  int min;
  int max;
  int range;
  int prio;
  int policy;
  struct sched_param param;

  if (priority < UV_THREAD_PRIORITY_LOWEST || priority > UV_THREAD_PRIORITY_HIGHEST)
    return UV_EINVAL;

  r = pthread_getschedparam(tid, &policy, &param);
  if (r != 0)
    return UV__ERR(errno);

#ifdef __linux__
/**
 * for Linux, when schedule policy is SCHED_OTHER (default), priority must be 0,
 * we should set the nice value in this case.
*/
  if (SCHED_OTHER == policy && pthread_equal(tid, pthread_self()))
    return set_nice_for_calling_thread(priority);
#endif

#ifdef __PASE__
  min = 1;
  max = 127;
#else
  min = sched_get_priority_min(policy);
  max = sched_get_priority_max(policy);
#endif

  if (min == -1 || max == -1)
    return UV__ERR(errno);

  range = max - min;

  switch (priority) {
    case UV_THREAD_PRIORITY_HIGHEST:
      prio = max;
      break;
    case UV_THREAD_PRIORITY_ABOVE_NORMAL:
      prio = min + range * 3 / 4;
      break;
    case UV_THREAD_PRIORITY_NORMAL:
      prio = min + range / 2;
      break;
    case UV_THREAD_PRIORITY_BELOW_NORMAL:
      prio = min + range / 4;
      break;
    case UV_THREAD_PRIORITY_LOWEST:
      prio = min;
      break;
    default:
      return 0;
  }

  if (param.sched_priority != prio) {
    param.sched_priority = prio;
    r = pthread_setschedparam(tid, policy, &param);
    if (r != 0)
      return UV__ERR(errno);  
  }

  return 0;
}